

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

idx_t duckdb::WindowBoundariesState::FindPrevStart(ValidityMask *mask,idx_t l,idx_t r,idx_t *n)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  idx_t iVar5;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  iVar5 = *n;
  iVar3 = r;
  if (puVar1 == (unsigned_long *)0x0) {
    if (iVar5 + l < r) {
      l = r - iVar5;
    }
    *n = (iVar5 - r) + l;
  }
  else {
    while (l < r) {
      uVar2 = puVar1[r - 1 >> 6];
      if (((~(uint)(r - 1) & 0x3f) == 0) && (uVar2 == 0)) {
        r = r - 0x40;
      }
      else {
        uVar4 = (ulong)((byte)((char)iVar3 - 1) & 0x3f);
        for (; (iVar3 = r, uVar4 != 0xffffffffffffffff && (l < r)); r = r - 1) {
          if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
            iVar5 = iVar5 - 1;
            *n = iVar5;
            if (iVar5 == 0) {
              return r - 1;
            }
          }
          uVar4 = uVar4 - 1;
        }
      }
    }
  }
  return l;
}

Assistant:

idx_t WindowBoundariesState::FindPrevStart(const ValidityMask &mask, const idx_t l, idx_t r, idx_t &n) {
	if (mask.AllValid()) {
		auto start = (r <= l + n) ? l : r - n;
		n -= r - start;
		return start;
	}

	while (l < r) {
		// If r is aligned with the start of a block, and the previous block is blank,
		// then skip backwards one block.
		idx_t entry_idx;
		idx_t shift;
		mask.GetEntryIndex(r - 1, entry_idx, shift);

		const auto block = mask.GetValidityEntry(entry_idx);
		if (mask.NoneValid(block) && (shift + 1 == ValidityMask::BITS_PER_VALUE)) {
			// r is nonzero (> l) and word aligned, so this will not underflow.
			r -= ValidityMask::BITS_PER_VALUE;
			continue;
		}

		// Loop backwards over the block
		// shift is probing r-1 >= l >= 0
		for (++shift; shift-- > 0 && l < r; --r) {
			// l < r ensures n == 1 if result is supposed to be NULL because of EXCLUDE
			if (mask.RowIsValid(block, shift) && --n == 0) {
				return MaxValue(l, r - 1);
			}
		}
	}

	//	Didn't find a start so return the start of the range
	return l;
}